

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O0

node_t __thiscall lsim::Simulator::merge_nodes(Simulator *this,node_t node_a,node_t node_b)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  size_type sVar4;
  size_type sVar5;
  reference __x;
  reference pvVar6;
  reference __x_00;
  SimComponent **comp;
  iterator __end1_1;
  iterator __begin1_1;
  component_set_t *__range1_1;
  uint *pin;
  iterator __end1;
  iterator __begin1;
  pin_container_t *__range1;
  value_type *meta_b;
  value_type *meta_a;
  node_t node_b_local;
  node_t node_a_local;
  Simulator *this_local;
  
  if (node_a != node_b) {
    release_node(this,node_b);
    pvVar2 = std::vector<lsim::NodeMetadata,_std::allocator<lsim::NodeMetadata>_>::operator[]
                       (&this->m_node_metadata,(ulong)node_a);
    pvVar3 = std::vector<lsim::NodeMetadata,_std::allocator<lsim::NodeMetadata>_>::operator[]
                       (&this->m_node_metadata,(ulong)node_b);
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&pvVar2->m_pins);
    sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&pvVar3->m_pins);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&pvVar2->m_pins,sVar4 + sVar5)
    ;
    __end1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&pvVar3->m_pins);
    pin = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&pvVar3->m_pins);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                  *)&pin);
      if (!bVar1) break;
      __x = __gnu_cxx::
            __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
            ::operator*(&__end1);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pvVar2->m_pins,__x);
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->m_pin_nodes,(ulong)*__x);
      *pvVar6 = node_a;
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator++(&__end1);
    }
    __end1_1 = std::
               set<lsim::SimComponent_*,_std::less<lsim::SimComponent_*>,_std::allocator<lsim::SimComponent_*>_>
               ::begin(&pvVar3->m_dependents);
    comp = (SimComponent **)
           std::
           set<lsim::SimComponent_*,_std::less<lsim::SimComponent_*>,_std::allocator<lsim::SimComponent_*>_>
           ::end(&pvVar3->m_dependents);
    while( true ) {
      bVar1 = std::operator!=(&__end1_1,(_Self *)&comp);
      if (!bVar1) break;
      __x_00 = std::_Rb_tree_const_iterator<lsim::SimComponent_*>::operator*(&__end1_1);
      std::
      set<lsim::SimComponent_*,_std::less<lsim::SimComponent_*>,_std::allocator<lsim::SimComponent_*>_>
      ::insert(&pvVar2->m_dependents,__x_00);
      std::_Rb_tree_const_iterator<lsim::SimComponent_*>::operator++(&__end1_1);
    }
    return node_a;
  }
  __assert_fail("node_a != node_b",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/simulator.cpp"
                ,0xb7,"node_t lsim::Simulator::merge_nodes(node_t, node_t)");
}

Assistant:

node_t Simulator::merge_nodes(node_t node_a, node_t node_b) {
    assert(node_a != node_b);
    release_node(node_b);
	
	auto& meta_a = m_node_metadata[node_a];
	auto& meta_b = m_node_metadata[node_b];
	
	meta_a.m_pins.reserve(meta_a.m_pins.size() + meta_b.m_pins.size());
	for (const auto& pin : meta_b.m_pins) {
		meta_a.m_pins.push_back(pin);
		m_pin_nodes[pin] = node_a;
	}

    for (const auto &comp : meta_b.m_dependents) {
        meta_a.m_dependents.insert(comp);
    }

    return node_a;
}